

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

int AlternativeLoader::getCountryID
              (string *countryName,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *countryList)

{
  pointer pbVar1;
  __type _Var2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer __lhs;
  
  __lhs = (countryList->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (countryList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  do {
    if (__lhs == pbVar1) {
      return 0;
    }
    _Var2 = std::operator==(__lhs,countryName);
    iVar3 = iVar3 + 1;
    __lhs = __lhs + 1;
  } while (!_Var2);
  return iVar3;
}

Assistant:

int AlternativeLoader::getCountryID(const std::string& countryName, const std::vector<std::string>& countryList) {
    int counter = 0;
    for(auto& i : countryList){
        if(i == countryName){
            return counter + 1;
        }
        counter++;
    }
    return 0;
}